

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::CompLayer::CompLayer
          (CompLayer *this,Layer *layerModel,VArenaAlloc *allocator)

{
  int iVar1;
  pointer ppOVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  Layer **layer;
  Layer *pLVar5;
  pointer ppLVar6;
  pointer ppOVar7;
  pointer ppLVar8;
  long lVar9;
  long lVar10;
  Layer *item;
  VSize in_stack_ffffffffffffffb8;
  VArenaAlloc *allocator_00;
  
  Layer::Layer(&this->super_Layer,layerModel);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__CompLayer_001406e8;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mClipper)._M_t.
  super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  ._M_t.
  super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl =
       (Clipper *)0x0;
  pLVar5 = (this->super_Layer).mLayerData;
  ppOVar2 = (pLVar5->super_Group).mChildren.
            super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar7 = (pLVar5->super_Group).mChildren.
            super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar2 != ppOVar7) {
    std::
    vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
    ::reserve(&this->mLayers,(long)ppOVar7 - (long)ppOVar2 >> 3);
    pLVar5 = (this->super_Layer).mLayerData;
    ppOVar7 = (pLVar5->super_Group).mChildren.
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  allocator_00 = (VArenaAlloc *)&this->mClipper;
  for (; ppOVar7 !=
         (pLVar5->super_Group).mChildren.
         super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
         ._M_impl.super__Vector_impl_data._M_start; ppOVar7 = ppOVar7 + -1) {
    in_stack_ffffffffffffffb8 =
         (VSize)createLayerItem((Layer *)in_stack_ffffffffffffffb8,allocator_00);
    if (in_stack_ffffffffffffffb8 != (VSize)0x0) {
      std::
      vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
      ::push_back(&this->mLayers,(value_type *)&stack0xffffffffffffffb8);
    }
    pLVar5 = (this->super_Layer).mLayerData;
  }
  ppLVar6 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar3 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppLVar6 == ppLVar3) {
      if (0 < (layerModel->mLayerSize).mh && 0 < (layerModel->mLayerSize).mw) {
        std::make_unique<rlottie::internal::renderer::Clipper,VSize>
                  ((VSize *)&stack0xffffffffffffffb8);
        std::
        __uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
        ::reset((__uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                 *)allocator_00,(pointer)in_stack_ffffffffffffffb8);
        std::
        unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
        ::~unique_ptr((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                       *)&stack0xffffffffffffffb8);
      }
      if (8 < (ulong)((long)(this->mLayers).
                            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mLayers).
                           super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        (this->super_Layer).mComplexContent = true;
      }
      return;
    }
    iVar1 = (*ppLVar6)->mLayerData->mParentId;
    if (-1 < iVar1) {
      ppLVar8 = (this->mLayers).
                super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppLVar4 = (this->mLayers).
                super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar9 = (long)ppLVar4 - (long)ppLVar8;
      for (lVar10 = lVar9 >> 5; 0 < lVar10; lVar10 = lVar10 + -1) {
        if ((*ppLVar8)->mLayerData->mId == iVar1) goto LAB_001250b2;
        if (ppLVar8[1]->mLayerData->mId == iVar1) {
          ppLVar8 = ppLVar8 + 1;
          goto LAB_001250b2;
        }
        if (ppLVar8[2]->mLayerData->mId == iVar1) {
          ppLVar8 = ppLVar8 + 2;
          goto LAB_001250b2;
        }
        if (ppLVar8[3]->mLayerData->mId == iVar1) {
          ppLVar8 = ppLVar8 + 3;
          goto LAB_001250b2;
        }
        ppLVar8 = ppLVar8 + 4;
        lVar9 = lVar9 + -0x20;
      }
      lVar9 = lVar9 >> 3;
      if (lVar9 == 1) {
LAB_00125091:
        if ((*ppLVar8)->mLayerData->mId != iVar1) {
          ppLVar8 = ppLVar4;
        }
      }
      else if (lVar9 == 2) {
LAB_00125080:
        if ((*ppLVar8)->mLayerData->mId != iVar1) {
          ppLVar8 = ppLVar8 + 1;
          goto LAB_00125091;
        }
      }
      else {
        if (lVar9 != 3) goto LAB_001250be;
        if ((*ppLVar8)->mLayerData->mId != iVar1) {
          ppLVar8 = ppLVar8 + 1;
          goto LAB_00125080;
        }
      }
LAB_001250b2:
      if (ppLVar8 != ppLVar4) {
        (*ppLVar6)->mParentLayer = *ppLVar8;
      }
    }
LAB_001250be:
    ppLVar6 = ppLVar6 + 1;
  } while( true );
}

Assistant:

renderer::CompLayer::CompLayer(model::Layer *layerModel, VArenaAlloc *allocator)
    : renderer::Layer(layerModel)
{
    if (!mLayerData->mChildren.empty())
        mLayers.reserve(mLayerData->mChildren.size());

    // 1. keep the layer in back-to-front order.
    // as lottie model keeps the data in front-toback-order.
    for (auto it = mLayerData->mChildren.crbegin();
         it != mLayerData->mChildren.rend(); ++it) {
        auto model = static_cast<model::Layer *>(*it);
        auto item = createLayerItem(model, allocator);
        if (item) mLayers.push_back(item);
    }

    // 2. update parent layer
    for (const auto &layer : mLayers) {
        int id = layer->parentId();
        if (id >= 0) {
            auto search =
                std::find_if(mLayers.begin(), mLayers.end(),
                             [id](const auto &val) { return val->id() == id; });
            if (search != mLayers.end()) layer->setParentLayer(*search);
        }
    }

    // 4. check if its a nested composition
    if (!layerModel->layerSize().empty()) {
        mClipper = std::make_unique<renderer::Clipper>(layerModel->layerSize());
    }

    if (mLayers.size() > 1) setComplexContent(true);
}